

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primetest.cpp
# Opt level: O2

int64_t power(int a,int n,int mod)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  
  lVar3 = (long)a;
  lVar2 = 1;
  for (; n != 0; n = n >> 1) {
    if ((n & 1U) != 0) {
      lVar2 = (lVar2 * lVar3) % (long)mod;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = lVar3 * lVar3;
    lVar3 = SUB168(auVar1 % SEXT816((long)mod),0);
  }
  return lVar2;
}

Assistant:

int64_t power(int a, int n, int mod)
{
	int64_t power = a, result = 1;

	while (n)
	{
		if (n & 1)
			result = (result*power) % mod;
		power = (power*power) % mod;
		n >>= 1;
	}
	return result;
}